

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O2

UChar * icu_63::ZoneMeta::findMetaZoneID(UnicodeString *mzid)

{
  UChar *pUVar1;
  
  umtx_initOnce(&gMetaZoneIDsInitOnce,initAvailableMetaZoneIDs);
  if (gMetaZoneIDTable != (UHashtable *)0x0) {
    pUVar1 = (UChar *)uhash_get_63(gMetaZoneIDTable,mzid);
    return pUVar1;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar*
ZoneMeta::findMetaZoneID(const UnicodeString& mzid) {
    umtx_initOnce(gMetaZoneIDsInitOnce, &initAvailableMetaZoneIDs);
    if (gMetaZoneIDTable == NULL) {
        return NULL;
    }
    return (const UChar*)uhash_get(gMetaZoneIDTable, &mzid);
}